

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O3

void __thiscall
agge::tests::LayoutTests::NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsFound
          (LayoutTests *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  void *pvVar2;
  wrap limiter;
  long lVar3;
  uint *puVar4;
  factory_ptr f;
  layout l;
  char_to_index indices [2];
  int local_484 [5];
  undefined1 local_470 [4];
  float fStack_46c;
  float local_468;
  undefined4 uStack_464;
  undefined1 local_460 [16];
  iterator local_450;
  positioned_glyph *ppStack_448;
  bool local_440;
  font_factory *local_438;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_430;
  undefined1 local_428 [4];
  float fStack_424;
  float fStack_420;
  undefined4 uStack_41c;
  vector_r local_418;
  pointer ppStack_410;
  iterator local_408;
  positioned_glyph *ppStack_400;
  bool local_3f8;
  vector<int,_std::allocator<int>_> local_3f0;
  vector<int,_std::allocator<int>_> local_3d8;
  vector<int,_std::allocator<int>_> local_3c0;
  vector<int,_std::allocator<int>_> local_3a8;
  vector<int,_std::allocator<int>_> local_390;
  undefined1 local_378 [4];
  float fStack_374;
  float fStack_370;
  undefined1 local_368 [24];
  vector<int,_std::allocator<int>_> local_350;
  vector<int,_std::allocator<int>_> local_338;
  vector<int,_std::allocator<int>_> local_320;
  int local_304 [3];
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_2f8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_2e0;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  uint uStack_2b4;
  undefined1 local_2b0 [32];
  undefined1 local_290 [24];
  _Alloc_hider local_278;
  char local_268 [32];
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_248;
  vector<int,_std::allocator<int>_> local_230;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_218;
  vector<int,_std::allocator<int>_> local_200;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_1e8;
  vector<int,_std::allocator<int>_> local_1d0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_1b8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1a0;
  string local_188;
  layout local_168;
  ref_text_line local_110;
  ref_text_line local_e8;
  ref_text_line local_c0;
  glyph local_98;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_98.metrics.dx = 3.2114266979681e-322;
  local_98.metrics.dy = 2.12199580677537e-314;
  local_98.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4014000000000000;
  local_98.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0x4010000000000000;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  create_single_font_factory<2ul,2ul>
            ((LayoutTests *)&local_438,(font_metrics *)this,
             (char_to_index (*) [2])(anonymous_namespace)::c_fm1,(glyph (*) [2])&local_98);
  local_168._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_168._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_168._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._glyphs._limit = (positioned_glyph *)0x0;
  local_168._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._glyphs._begin = (positioned_glyph *)0x0;
  local_168._glyphs._end = (positioned_glyph *)0x0;
  local_168._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _local_470 = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"AAAAA   AAAA    AA","");
  R((richtext_t *)local_2b0,(string *)local_470);
  local_2c8 = 0x421c0000;
  uStack_2c4 = 0;
  uStack_2c0 = 0;
  uStack_2bc = 0;
  uStack_2b8 = 0;
  uStack_2b4 = uStack_2b4 & 0xffffff00;
  lVar3 = (ulong)uStack_2b4 << 0x20;
  limiter._sow.next = (int)lVar3;
  limiter._previous_space = (bool)(char)((ulong)lVar3 >> 0x20);
  limiter._21_3_ = (int3)((ulong)lVar3 >> 0x28);
  limiter._limit = 39.0;
  limiter._eow.extent = 0.0;
  limiter._eow.next = 0;
  limiter._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&local_168,(richtext_t *)local_2b0,limiter,local_438);
  if (local_278._M_p != local_268) {
    operator_delete(local_278._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector((vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
             *)local_290);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_);
  }
  if (_local_470 != local_460) {
    operator_delete(_local_470);
  }
  peVar1 = (local_438->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (local_438->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 0;
  local_304[2] = 0;
  local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_1d0,
             (iterator)
             local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_304 + 2);
  std::vector<int,_std::allocator<int>_>::vector(&local_3c0,&local_1d0);
  local_484[4] = 0;
  if (local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3c0,
               (iterator)
               local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_484 + 4);
  }
  else {
    *local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_3a8,&local_3c0);
  local_484[3] = 0;
  if (local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3a8,
               (iterator)
               local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_484 + 3);
  }
  else {
    *local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_390,&local_3a8);
  local_484[2] = 0;
  if (local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_390,
               (iterator)
               local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_484 + 2);
  }
  else {
    *local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_320,&local_390);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_290._0_8_ = (pointer)0x0;
  local_290._8_8_ = (pointer)0x0;
  local_2b0._16_8_ = 0;
  local_2b0._24_8_ = (void *)0x0;
  local_290[0x10] = false;
  local_2b0._0_8_ = peVar1;
  local_2b0._8_8_ = this_00;
  if (local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar4 = (uint *)local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      local_470 = (undefined1  [4])*puVar4;
      fStack_46c = 0.0;
      local_468 = 0.0;
      if (local_290._0_8_ == local_290._8_8_) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_2b0 + 0x18),(iterator)local_290._0_8_,(positioned_glyph *)local_470);
      }
      else {
        ((vector_r *)(local_290._0_8_ + 4))->dy = 0.0;
        *(ulong *)local_290._0_8_ = (ulong)(uint)local_470;
        local_290._0_8_ = local_290._0_8_ + 0xc;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != (uint *)local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_1b8,1,(value_type *)local_2b0,(allocator_type *)local_470);
  ref_text_line::ref_text_line(&local_c0,0.0,10.0,0.0,&local_1b8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_2f8,1,&local_c0,(allocator_type *)local_470);
  peVar1 = (local_438->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (local_438->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 0;
  local_304[1] = 0;
  local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_200,
             (iterator)
             local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_304 + 1);
  std::vector<int,_std::allocator<int>_>::vector(&local_3f0,&local_200);
  local_484[1] = 0;
  if (local_3f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3f0,
               (iterator)
               local_3f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_484 + 1);
  }
  else {
    *local_3f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_3f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_3d8,&local_3f0);
  local_484[0] = 0;
  if (local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_3d8,
               (iterator)
               local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_484);
  }
  else {
    *local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_338,&local_3d8);
  local_470 = SUB84(peVar1,0);
  fStack_46c = (float)((ulong)peVar1 >> 0x20);
  local_468 = SUB84(this_01,0);
  uStack_464 = (undefined4)((ulong)this_01 >> 0x20);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_450._M_current = (positioned_glyph *)0x0;
  ppStack_448 = (positioned_glyph *)0x0;
  local_460._0_8_ = 0;
  local_460._8_8_ = (void *)0x0;
  local_440 = false;
  if (local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar4 = (uint *)local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      local_428 = (undefined1  [4])*puVar4;
      fStack_424 = 0.0;
      fStack_420 = 0.0;
      if (local_450._M_current == ppStack_448) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_460 + 8),local_450,(positioned_glyph *)local_428);
      }
      else {
        ((local_450._M_current)->d).dy = 0.0;
        (local_450._M_current)->index = (int)(ulong)(uint)local_428;
        ((local_450._M_current)->d).dx = (float)(int)((ulong)(uint)local_428 >> 0x20);
        local_450._M_current = local_450._M_current + 1;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != (uint *)local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_1e8,1,(value_type *)local_470,(allocator_type *)local_428);
  ref_text_line::ref_text_line(&local_e8,0.0,24.0,0.0,&local_1e8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_2f8,&local_e8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_2e0,&local_2f8);
  peVar1 = (local_438->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_02 = (local_438->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 0;
  local_304[0] = 0;
  local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_230,
             (iterator)
             local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_304);
  std::vector<int,_std::allocator<int>_>::vector(&local_350,&local_230);
  local_428 = SUB84(peVar1,0);
  fStack_424 = (float)((ulong)peVar1 >> 0x20);
  fStack_420 = SUB84(this_02,0);
  uStack_41c = (undefined4)((ulong)this_02 >> 0x20);
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  local_408._M_current = (positioned_glyph *)0x0;
  ppStack_400 = (positioned_glyph *)0x0;
  local_418.dx = 0.0;
  local_418.dy = 0.0;
  ppStack_410 = (pointer)0x0;
  local_3f8 = false;
  if (local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar4 = (uint *)local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      local_378 = (undefined1  [4])*puVar4;
      fStack_374 = 0.0;
      fStack_370 = 0.0;
      if (local_408._M_current == ppStack_400) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   &ppStack_410,local_408,(positioned_glyph *)local_378);
      }
      else {
        ((local_408._M_current)->d).dy = 0.0;
        (local_408._M_current)->index = (int)(ulong)(uint)local_378;
        ((local_408._M_current)->d).dx = (float)(int)((ulong)(uint)local_378 >> 0x20);
        local_408._M_current = local_408._M_current + 1;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != (uint *)local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_218,1,(value_type *)local_428,(allocator_type *)local_378);
  ref_text_line::ref_text_line(&local_110,0.0,38.0,0.0,&local_218);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_2e0,&local_110);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_1a0,&local_2e0);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_248,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_168._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_168._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_378);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_378,&local_188,0x200);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_1a0,&local_248,(LocationInfo *)local_378);
  if ((undefined1 *)CONCAT44(fStack_374,local_378) != local_368) {
    operator_delete((undefined1 *)CONCAT44(fStack_374,local_378));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if (local_248.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1a0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_110._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_218);
  if (ppStack_410 != (pointer)0x0) {
    operator_delete(ppStack_410);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_41c,fStack_420) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_41c,fStack_420));
  }
  if ((uint *)local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_350.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_2e0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_e8._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_1e8);
  if ((void *)local_460._8_8_ != (void *)0x0) {
    operator_delete((void *)local_460._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_464,local_468) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_464,local_468));
  }
  if ((uint *)local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_2f8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_c0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_1b8);
  if ((void *)local_2b0._24_8_ != (void *)0x0) {
    operator_delete((void *)local_2b0._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_);
  }
  if ((uint *)local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_320.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_390.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_168._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_168._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_168._glyph_runs);
  if (local_168._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_168._glyphs._begin);
  }
  if (local_430 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_430);
  }
  lVar3 = 0x38;
  do {
    pvVar2 = *(void **)((long)&local_98.outline.
                               super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar3);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

test( NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsFound )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 0 }, { L' ', 1 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 5, 0 } },
					{ { 4, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout l;

				// ACT
				l.process(R("AAAAA   AAAA    AA"), limit::wrap(39.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 0 + 0 + 0 + 0))
					+ ref_text_line(0.0f, 24.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 0 + 0 + 0))
					+ ref_text_line(0.0f, 38.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 0)),
					mkvector(l.begin(), l.end()));
			}